

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_thread_exdata2(lua_State *L)

{
  long lVar1;
  TValue *pTVar2;
  int iVar3;
  GCcdata *pGVar4;
  void *pvVar5;
  
  if (L->top == L->base) {
    lVar1 = *(long *)((L->glref).ptr64 + 0x180);
    if (lVar1 == 0) {
      lj_err_caller(L,LJ_ERR_FFI_NOTLOAD);
    }
    *(lua_State **)(lVar1 + 0x10) = L;
    pvVar5 = lj_mem_newgco(L,0x18);
    *(undefined1 *)((long)pvVar5 + 9) = 10;
    *(undefined2 *)((long)pvVar5 + 10) = 0x11;
    *(void **)((long)pvVar5 + 0x10) = L->exdata2;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->u64 = (ulong)pvVar5 | 0xfffa800000000000;
    iVar3 = 1;
  }
  else {
    pGVar4 = lj_lib_checkcdata(L,1);
    L->exdata2 = (void *)pGVar4[1].nextgc.gcptr64;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

LJLIB_NOREG LJLIB_CF(thread_exdata2) LJLIB_REC(.)
{
  ptrdiff_t nargs = L->top - L->base;
  GCcdata *cd;

  if (nargs == 0) {
    CTState *cts = ctype_ctsG(G(L));
    if (cts == NULL)
      lj_err_caller(L, LJ_ERR_FFI_NOTLOAD);
    cts->L = L;  /* Save L for errors and allocations. */

    cd = lj_cdata_new(cts, CTID_P_VOID, CTSIZE_PTR);
    cdata_setptr(cdataptr(cd), CTSIZE_PTR, L->exdata2);
    setcdataV(L, L->top++, cd);
    return 1;
  }

  cd = lj_lib_checkcdata(L, 1);
  L->exdata2 = cdata_getptr(cdataptr(cd), CTSIZE_PTR);
  return 0;
}